

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O2

bool __thiscall
dlib::
array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
::move_next(array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            *this)

{
  data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *pdVar1;
  
  if (this->_at_start == false) {
    if (this->last_pos <= this->pos) {
      this->pos = (data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                   *)0x0;
      return false;
    }
    pdVar1 = this->pos + 1;
  }
  else {
    this->_at_start = false;
    if (this->array_size == 0) {
      return false;
    }
    pdVar1 = this->array_elements;
  }
  this->pos = pdVar1;
  return true;
}

Assistant:

bool array<T,mem_manager>::
    move_next (
    ) const
    {
        if (!_at_start)
        {
            if (pos < last_pos)
            {
                ++pos;
                return true;
            }
            else
            {
                pos = 0;
                return false;
            }
        }
        else
        {
            _at_start = false;
            if (array_size > 0)
            {
                pos = array_elements;
                return true;
            }
            else
            {
                return false;
            }
        }
    }